

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O3

void __thiscall
cfd::core::Address::DecodeAddress
          (Address *this,string *address_string,
          vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          *network_parameters)

{
  pointer pAVar1;
  AddressFormatData *this_00;
  uint8_t uVar2;
  pointer pcVar3;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *p_Var4;
  undefined8 uVar5;
  Address *pAVar6;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *pvVar7;
  uint8_t uVar8;
  WitnessVersion WVar9;
  AddressType AVar10;
  NetType_conflict NVar11;
  int iVar12;
  value_type_conflict *__val;
  long lVar13;
  CfdException *pCVar14;
  pointer pAVar15;
  undefined1 *puVar16;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *p_Var17;
  bool bVar18;
  int ret;
  Script script;
  size_t written;
  string segwit_prefix;
  string bs58;
  int local_134;
  undefined1 local_130 [16];
  undefined1 local_120 [40];
  undefined1 local_f8 [40];
  string local_d0;
  size_t local_b0;
  Address *local_a8;
  NetType_conflict local_9c;
  long *local_98;
  long local_90;
  long local_88 [2];
  long *local_78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_70;
  long local_68 [2];
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *local_38;
  
  if ((DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
       ::kBech32Separator_abi_cxx11_ == '\0') &&
     (iVar12 = __cxa_guard_acquire(&DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
                                    ::kBech32Separator_abi_cxx11_), iVar12 != 0)) {
    DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
    ::kBech32Separator_abi_cxx11_._M_dataplus._M_p =
         (pointer)&DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
                   ::kBech32Separator_abi_cxx11_.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
                ::kBech32Separator_abi_cxx11_,"1","");
    __cxa_atexit(::std::__cxx11::string::~string,
                 &DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
                  ::kBech32Separator_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
                         ::kBech32Separator_abi_cxx11_);
  }
  local_78 = local_68;
  pcVar3 = (address_string->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar3,pcVar3 + address_string->_M_string_length);
  local_98 = local_88;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
  local_134 = -1;
  local_a8 = this;
  local_38 = network_parameters;
  if (network_parameters ==
      (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)0x0) {
    puVar16 = kBitcoinAddressFormatList;
    if (g_custom_btc_addr_format_list != DAT_008a63c8) {
      puVar16 = (undefined1 *)&g_custom_btc_addr_format_list;
    }
    ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
           local_f8,(vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     *)puVar16);
    if (local_f8._0_8_ != local_f8._8_8_) {
      p_Var17 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_f8._0_8_;
      do {
        AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_d0,(AddressFormatData *)p_Var17);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_130,&local_d0,
                         &DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
                          ::kBech32Separator_abi_cxx11_);
        lVar13 = ::std::__cxx11::string::find((char *)&local_78,local_130._0_8_,0);
        if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_130._0_8_ !=
            (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_120) {
          operator_delete((void *)local_130._0_8_,local_120._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if (lVar13 == 0) {
          AddressFormatData::GetBech32Hrp_abi_cxx11_
                    ((string *)local_130,(AddressFormatData *)p_Var17);
          ::std::__cxx11::string::operator=((string *)&local_98,(string *)local_130);
          if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_130._0_8_ !=
              (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_120) {
            operator_delete((void *)local_130._0_8_,local_120._0_8_ + 1);
          }
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&local_a8->format_data_,p_Var17);
          break;
        }
        p_Var17 = p_Var17 + 1;
      } while (p_Var17 !=
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_f8._8_8_);
    }
    ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
    ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
            local_f8);
  }
  else {
    p_Var17 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(network_parameters->
                 super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                 )._M_impl.super__Vector_impl_data._M_start;
    p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(network_parameters->
                super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                )._M_impl.super__Vector_impl_data._M_finish;
    if (p_Var17 != p_Var4) {
      do {
        AddressFormatData::GetBech32Hrp_abi_cxx11_(&local_d0,(AddressFormatData *)p_Var17);
        if (local_d0._M_string_length == 0) {
          bVar18 = false;
        }
        else {
          AddressFormatData::GetBech32Hrp_abi_cxx11_
                    ((string *)local_f8,(AddressFormatData *)p_Var17);
          if ((ulong)local_f8._8_8_ < local_70) {
            AddressFormatData::GetBech32Hrp_abi_cxx11_
                      ((string *)local_58,(AddressFormatData *)p_Var17);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_130,(string *)local_58,
                             &DecodeAddress(std::__cxx11::string,std::vector<cfd::core::AddressFormatData,std::allocator<cfd::core::AddressFormatData>>const*)
                              ::kBech32Separator_abi_cxx11_);
            lVar13 = ::std::__cxx11::string::find((char *)&local_78,local_130._0_8_,0);
            if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_130._0_8_ !=
                (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_120) {
              operator_delete((void *)local_130._0_8_,local_120._0_8_ + 1);
            }
            bVar18 = lVar13 == 0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._0_8_ != &local_48) {
              operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
            }
          }
          else {
            bVar18 = false;
          }
          if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_f8._0_8_ !=
              (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_f8 + 0x10)) {
            operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if (bVar18) {
          AddressFormatData::GetBech32Hrp_abi_cxx11_
                    ((string *)local_130,(AddressFormatData *)p_Var17);
          ::std::__cxx11::string::operator=((string *)&local_98,(string *)local_130);
          if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_130._0_8_ !=
              (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_120) {
            operator_delete((void *)local_130._0_8_,local_120._0_8_ + 1);
          }
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&local_a8->format_data_,p_Var17);
          break;
        }
        p_Var17 = p_Var17 + 1;
      } while (p_Var17 != p_Var4);
    }
  }
  local_f8._0_8_ = (pointer)0x0;
  local_f8._8_8_ = (pointer)0x0;
  local_f8._16_8_ = 0;
  local_f8._0_8_ = operator_new(0x80);
  pvVar7 = local_38;
  pAVar6 = local_a8;
  local_f8._8_8_ = local_f8._0_8_ + 0x80;
  *(uchar *)(local_f8._0_8_ + 0x70) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x71) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x72) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x73) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x74) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x75) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x76) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x77) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x78) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x79) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x7a) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x7b) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x7c) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x7d) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x7e) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x7f) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x60) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x61) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x62) = '\0';
  *(uchar *)(local_f8._0_8_ + 99) = '\0';
  *(uchar *)(local_f8._0_8_ + 100) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x65) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x66) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x67) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x68) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x69) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x6a) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x6b) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x6c) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x6d) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x6e) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x6f) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x50) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x51) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x52) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x53) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x54) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x55) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x56) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x57) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x58) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x59) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x5a) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x5b) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x5c) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x5d) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x5e) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x5f) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x40) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x41) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x42) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x43) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x44) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x45) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x46) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x47) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x48) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x49) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x4a) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x4b) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x4c) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x4d) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x4e) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x4f) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x30) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x31) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x32) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x33) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x34) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x35) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x36) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x37) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x38) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x39) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x3a) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x3b) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x3c) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x3d) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x3e) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x3f) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x20) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x21) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x22) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x23) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x24) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x25) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x26) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x27) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x28) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x29) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x2a) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x2b) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x2c) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x2d) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x2e) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x2f) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x10) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x11) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x12) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x13) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x14) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x15) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x16) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x17) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x18) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x19) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x1a) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x1b) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x1c) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x1d) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x1e) = '\0';
  *(uchar *)(local_f8._0_8_ + 0x1f) = '\0';
  *(uchar *)(local_f8._0_8_ + 0) = '\0';
  *(uchar *)(local_f8._0_8_ + 1) = '\0';
  *(uchar *)(local_f8._0_8_ + 2) = '\0';
  *(uchar *)(local_f8._0_8_ + 3) = '\0';
  *(uchar *)(local_f8._0_8_ + 4) = '\0';
  *(uchar *)(local_f8._0_8_ + 5) = '\0';
  *(uchar *)(local_f8._0_8_ + 6) = '\0';
  *(uchar *)(local_f8._0_8_ + 7) = '\0';
  *(uchar *)(local_f8._0_8_ + 8) = '\0';
  *(uchar *)(local_f8._0_8_ + 9) = '\0';
  *(uchar *)(local_f8._0_8_ + 10) = '\0';
  *(uchar *)(local_f8._0_8_ + 0xb) = '\0';
  *(uchar *)(local_f8._0_8_ + 0xc) = '\0';
  *(uchar *)(local_f8._0_8_ + 0xd) = '\0';
  *(uchar *)(local_f8._0_8_ + 0xe) = '\0';
  *(uchar *)(local_f8._0_8_ + 0xf) = '\0';
  local_b0 = 0;
  local_f8._16_8_ = local_f8._8_8_;
  if (local_90 == 0) {
    local_134 = wally_base58_to_bytes((char *)local_78,1,(uchar *)local_f8._0_8_,0x80,&local_b0);
    if (local_134 != 0) {
      local_130._0_8_ = "cfdcore_address.cpp";
      local_130._8_4_ = 0x4e6;
      local_120._0_8_ = "DecodeAddress";
      logger::log<int&>((CfdSourceLocation *)local_130,kCfdLogLevelWarning,
                        "wally_base58_to_bytes error. ret={}.",&local_134);
      iVar12 = local_134;
      pCVar14 = (CfdException *)__cxa_allocate_exception(0x30);
      local_130._0_8_ = local_120;
      if (iVar12 != -2) {
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_130,"Base58 decode error.","");
        CfdException::CfdException(pCVar14,kCfdInternalError,(string *)local_130);
        __cxa_throw(pCVar14,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_130,"Base58 decode error.","");
      CfdException::CfdException(pCVar14,kCfdIllegalArgumentError,(string *)local_130);
      __cxa_throw(pCVar14,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8,local_b0);
    if (pvVar7 == (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                   *)0x0) {
      puVar16 = kBitcoinAddressFormatList;
      if (g_custom_btc_addr_format_list != DAT_008a63c8) {
        puVar16 = (undefined1 *)&g_custom_btc_addr_format_list;
      }
      ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             local_130,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             puVar16);
      for (p_Var17 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_130._0_8_;
          p_Var17 !=
          (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)CONCAT44(local_130._12_4_,local_130._8_4_); p_Var17 = p_Var17 + 1) {
        uVar2 = *(uint8_t *)local_f8._0_8_;
        uVar8 = AddressFormatData::GetP2shPrefix((AddressFormatData *)p_Var17);
        if (uVar2 == uVar8) {
          if (1 < pAVar6->addr_type_ - kP2shP2wshAddress) {
            pAVar6->addr_type_ = kP2shAddress;
          }
LAB_0035d635:
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&pAVar6->format_data_,p_Var17);
          ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
          ::~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     *)local_130);
          goto LAB_0035d64e;
        }
        uVar2 = *(uint8_t *)local_f8._0_8_;
        uVar8 = AddressFormatData::GetP2pkhPrefix((AddressFormatData *)p_Var17);
        if (uVar2 == uVar8) {
          pAVar6->addr_type_ = kP2pkhAddress;
          goto LAB_0035d635;
        }
      }
      ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )local_130);
    }
    else {
      p_Var4 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(pvVar7->
                  super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      for (p_Var17 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)(pvVar7->
                        super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                        )._M_impl.super__Vector_impl_data._M_start; p_Var17 != p_Var4;
          p_Var17 = p_Var17 + 1) {
        uVar2 = *(uint8_t *)local_f8._0_8_;
        uVar8 = AddressFormatData::GetP2shPrefix((AddressFormatData *)p_Var17);
        if (uVar2 == uVar8) {
          if (1 < pAVar6->addr_type_ - kP2shP2wshAddress) {
            pAVar6->addr_type_ = kP2shAddress;
          }
LAB_0035d5b0:
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)&pAVar6->format_data_,p_Var17);
LAB_0035d64e:
          pAVar6->witness_ver_ = kVersionNone;
          pAVar1 = (pointer)(local_f8._0_8_ + 1);
          if (pAVar1 != (pointer)local_f8._8_8_) {
            memmove((void *)local_f8._0_8_,pAVar1,local_f8._8_8_ - (long)pAVar1);
          }
          local_f8._8_8_ =
               (long)&(((pointer)(local_f8._8_8_ + -0x30))->map_)._M_t._M_impl.super__Rb_tree_header
                      ._M_node_count + 7;
          goto LAB_0035d67e;
        }
        uVar2 = *(uint8_t *)local_f8._0_8_;
        uVar8 = AddressFormatData::GetP2pkhPrefix((AddressFormatData *)p_Var17);
        if (uVar2 == uVar8) {
          pAVar6->addr_type_ = kP2pkhAddress;
          goto LAB_0035d5b0;
        }
      }
    }
    local_130._0_8_ = "cfdcore_address.cpp";
    local_130._8_4_ = 0x50f;
    local_120._0_8_ = "DecodeAddress";
    logger::log<>((CfdSourceLocation *)local_130,kCfdLogLevelWarning,"Unknown address prefix.");
    pCVar14 = (CfdException *)__cxa_allocate_exception(0x30);
    local_130._0_8_ = local_120;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_130,"Unknown address prefix.","");
    CfdException::CfdException(pCVar14,kCfdIllegalArgumentError,(string *)local_130);
    __cxa_throw(pCVar14,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_134 = wally_addr_segwit_to_bytes
                        ((char *)local_78,(char *)local_98,0,(uchar *)local_f8._0_8_,0x80,&local_b0)
  ;
  if (local_134 != 0) {
    local_130._0_8_ = "cfdcore_address.cpp";
    local_130._8_4_ = 0x4c0;
    local_120._0_8_ = "DecodeAddress";
    logger::log<int&>((CfdSourceLocation *)local_130,kCfdLogLevelWarning,
                      "wally_addr_segwit_to_bytes error. ret={}.",&local_134);
    iVar12 = local_134;
    pCVar14 = (CfdException *)__cxa_allocate_exception(0x30);
    local_130._0_8_ = local_120;
    if (iVar12 != -2) {
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_130,"Segwit-address decode error.","");
      CfdException::CfdException(pCVar14,kCfdInternalError,(string *)local_130);
      __cxa_throw(pCVar14,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_130,"Segwit-address decode error.","");
    CfdException::CfdException(pCVar14,kCfdIllegalArgumentError,(string *)local_130);
    __cxa_throw(pCVar14,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8,local_b0);
  ByteData::ByteData((ByteData *)&local_d0,(uint8_t *)local_f8._0_8_,(uint32_t)local_b0);
  Script::Script((Script *)local_130,(ByteData *)&local_d0);
  if (local_d0._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_d0._M_dataplus._M_p,
                    local_d0.field_2._M_allocated_capacity - (long)local_d0._M_dataplus._M_p);
  }
  bVar18 = Script::IsWitnessProgram((Script *)local_130);
  if (!bVar18) {
    pCVar14 = (CfdException *)__cxa_allocate_exception(0x30);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"address decode check error.","");
    CfdException::CfdException(pCVar14,kCfdInternalError,&local_d0);
    __cxa_throw(pCVar14,&CfdException::typeinfo,CfdException::~CfdException);
  }
  WVar9 = Script::GetWitnessVersion((Script *)local_130);
  uVar5 = local_f8._0_8_;
  pAVar6->witness_ver_ = WVar9;
  if (WVar9 == kVersion0) {
    if (local_b0 == 0x16) {
      AVar10 = kP2wpkhAddress;
    }
    else {
      if (local_b0 != 0x22) goto LAB_0035d5e3;
      AVar10 = kP2wshAddress;
    }
  }
  else {
    if (WVar9 != kVersion1) goto LAB_0035d5e3;
    AVar10 = kTaprootAddress;
    if (local_b0 != 0x22) {
      pCVar14 = (CfdException *)__cxa_allocate_exception(0x30);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"segwit v1 address decode check error.","");
      CfdException::CfdException(pCVar14,kCfdInternalError,&local_d0);
      __cxa_throw(pCVar14,&CfdException::typeinfo,CfdException::~CfdException);
    }
  }
  pAVar6->addr_type_ = AVar10;
LAB_0035d5e3:
  pAVar1 = (pointer)(local_f8._0_8_ + 2);
  pAVar15 = pAVar1;
  if (local_f8._8_8_ - (long)pAVar1 != 0) {
    memmove((void *)local_f8._0_8_,pAVar1,local_f8._8_8_ - (long)pAVar1);
    pAVar15 = (pointer)local_f8._8_8_;
  }
  if (pAVar15 != (pointer)(uVar5 + ((long)pAVar15 - (long)pAVar1))) {
    local_f8._8_8_ = (pointer)(uVar5 + ((long)pAVar15 - (long)pAVar1));
  }
  Script::~Script((Script *)local_130);
LAB_0035d67e:
  ByteData::ByteData((ByteData *)local_130,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8);
  ByteData::operator=(&pAVar6->hash_,(ByteData *)local_130);
  if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)local_130._0_8_ !=
      (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)0x0) {
    operator_delete((void *)local_130._0_8_,local_120._0_8_ - local_130._0_8_);
  }
  if (pAVar6->witness_ver_ == kVersion1) {
    SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_130,&pAVar6->hash_);
    ByteData256::operator=(&(pAVar6->schnorr_pubkey_).data_,(ByteData256 *)local_130);
    if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_130._0_8_ !=
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x0) {
      operator_delete((void *)local_130._0_8_,local_120._0_8_ - local_130._0_8_);
    }
  }
  this_00 = &pAVar6->format_data_;
  NVar11 = AddressFormatData::GetNetType(this_00);
  pAVar6->type_ = NVar11;
  local_58._0_8_ = "cfdcore_address.cpp";
  local_58._8_4_ = 0x51d;
  local_48._M_allocated_capacity = 0x6148b8;
  local_9c = AddressFormatData::GetNetType(this_00);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"nettype","");
  AddressFormatData::GetString((string *)local_130,this_00,&local_d0);
  logger::log<cfd::core::NetType&,std::__cxx11::string&>
            ((CfdSourceLocation *)local_58,kCfdLogLevelInfo,"DecodeAddress nettype={},{}",&local_9c,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130);
  if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)local_130._0_8_ !=
      (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)local_120) {
    operator_delete((void *)local_130._0_8_,local_120._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((uint8_t *)local_f8._0_8_ != (uint8_t *)0x0) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ - local_f8._0_8_);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  return;
}

Assistant:

void Address::DecodeAddress(
    std::string address_string,
    const std::vector<AddressFormatData>* network_parameters) {
  static const std::string kBech32Separator = "1";
  static const auto StartsWith = [](const std::string& message,
                                    const std::string& bech32_hrp) -> bool {
    return (message.find(bech32_hrp + kBech32Separator) == 0);
  };

  std::string bs58 = address_string;
  std::string segwit_prefix = "";
  int ret = -1;

  if (network_parameters != nullptr) {
    for (const AddressFormatData& param : *network_parameters) {
      // Custom parameter
      if ((!param.GetBech32Hrp().empty()) &&
          (param.GetBech32Hrp().length() < bs58.length()) &&
          (StartsWith(bs58, param.GetBech32Hrp()))) {
        segwit_prefix = param.GetBech32Hrp();
        format_data_ = param;
        break;
      }
    }
  } else {
    for (const auto& param : GetBitcoinAddressFormatList()) {
      if (StartsWith(bs58, param.GetBech32Hrp())) {
        segwit_prefix = param.GetBech32Hrp();
        format_data_ = param;
        break;
      }
    }
  }

  std::vector<uint8_t> data_part(128);
  size_t written = 0;

  if (!segwit_prefix.empty()) {
    // Bech32 Address
    ret = wally_addr_segwit_to_bytes(
        bs58.data(), segwit_prefix.data(), 0, data_part.data(),
        data_part.size(), &written);

    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_addr_segwit_to_bytes error. ret={}.", ret);
      if (ret == WALLY_EINVAL) {
        throw CfdException(
            kCfdIllegalArgumentError, "Segwit-address decode error.");
      } else {
        throw CfdException(kCfdInternalError, "Segwit-address decode error.");
      }
    }

    data_part.resize(written);
    Script script(ByteData(data_part.data(), static_cast<uint32_t>(written)));
    if (!script.IsWitnessProgram()) {
      throw CfdException(kCfdInternalError, "address decode check error.");
    }
    witness_ver_ = script.GetWitnessVersion();

    if (witness_ver_ == kVersion1) {
      if (written != (SchnorrPubkey::kSchnorrPubkeySize + 2)) {
        throw CfdException(
            kCfdInternalError, "segwit v1 address decode check error.");
      }
      SetAddressType(kTaprootAddress);
    } else if (witness_ver_ == kVersion0) {
      if (written == kScriptHashP2wpkhLength) {
        SetAddressType(kP2wpkhAddress);
      } else if (written == kScriptHashP2wshLength) {
        SetAddressType(kP2wshAddress);
      }
    }

    // Delete 0byte:WitnessVersion and 1byte:data_part
    data_part.erase(data_part.begin(), data_part.begin() + 2);

  } else {
    ret = wally_base58_to_bytes(
        bs58.data(), BASE58_FLAG_CHECKSUM, data_part.data(), data_part.size(),
        &written);
    if (ret != WALLY_OK) {
      warn(CFD_LOG_SOURCE, "wally_base58_to_bytes error. ret={}.", ret);
      if (ret == WALLY_EINVAL) {
        throw CfdException(kCfdIllegalArgumentError, "Base58 decode error.");
      } else {
        throw CfdException(kCfdInternalError, "Base58 decode error.");
      }
    }

    data_part.resize(written);

    bool find_address_type = false;
    if (network_parameters != nullptr) {
      for (const AddressFormatData& param : *network_parameters) {
        if (data_part[0] == param.GetP2shPrefix()) {
          SetAddressType(kP2shAddress);
          find_address_type = true;
          format_data_ = param;
          break;
        } else if (data_part[0] == param.GetP2pkhPrefix()) {
          SetAddressType(kP2pkhAddress);
          find_address_type = true;
          format_data_ = param;
          break;
        }
      }
    } else {
      for (const auto& param : GetBitcoinAddressFormatList()) {
        if (data_part[0] == param.GetP2shPrefix()) {
          SetAddressType(kP2shAddress);
          find_address_type = true;
          format_data_ = param;
          break;
        } else if (data_part[0] == param.GetP2pkhPrefix()) {
          SetAddressType(kP2pkhAddress);
          find_address_type = true;
          format_data_ = param;
          break;
        }
      }
    }
    if (!find_address_type) {
      warn(CFD_LOG_SOURCE, "Unknown address prefix.");
      throw CfdException(kCfdIllegalArgumentError, "Unknown address prefix.");
    }
    witness_ver_ = kVersionNone;

    // Delete 0byte:prefix.
    data_part.erase(data_part.begin());
  }

  // Setting for Hash.
  hash_ = ByteData(data_part);
  if (witness_ver_ == kVersion1) schnorr_pubkey_ = SchnorrPubkey(hash_);
  SetNetType(format_data_);
  info(
      CFD_LOG_SOURCE, "DecodeAddress nettype={},{}", format_data_.GetNetType(),
      format_data_.GetString(kNettype));
}